

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_0>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_0> *this)

{
  code *pcVar1;
  long *plVar2;
  C_A_T_C_H_T_E_S_T_0 obj;
  communicator cStack_28;
  
  diy::mpi::communicator::communicator(&cStack_28);
  pcVar1 = (code *)this->m_testAsMethod;
  plVar2 = (long *)((long)&cStack_28.comm_.data + *(long *)&this->field_0x10);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
  }
  (*pcVar1)(plVar2);
  diy::mpi::communicator::~communicator(&cStack_28);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }